

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26382a::FilteredDirectoryContentsTask::provideValue
          (FilteredDirectoryContentsTask *this,TaskInterface param_1,uintptr_t inputID,KeyType *key,
          ValueType *value)

{
  BuildValue local_a8;
  ValueType *local_38;
  ValueType *value_local;
  KeyType *key_local;
  uintptr_t inputID_local;
  FilteredDirectoryContentsTask *this_local;
  TaskInterface param_1_local;
  
  param_1_local.impl = param_1.ctx;
  this_local = (FilteredDirectoryContentsTask *)param_1.impl;
  if (inputID == 1) {
    local_38 = value;
    value_local = (ValueType *)key;
    key_local = (KeyType *)inputID;
    inputID_local = (uintptr_t)this;
    llbuild::buildsystem::BuildValue::fromData(&local_a8,value);
    llbuild::buildsystem::BuildValue::operator=(&this->directoryValue,&local_a8);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_a8);
  }
  return;
}

Assistant:

virtual void provideValue(TaskInterface, uintptr_t inputID,
                            const KeyType& key, const ValueType& value) override {
    if (inputID == 1) {
      directoryValue = BuildValue::fromData(value);
      return;
    }
  }